

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O2

void __thiscall leveldb::MemTableIterator::Next(MemTableIterator *this)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Next(&this->iter_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Next() override { iter_.Next(); }